

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

bool __thiscall Vehicle::owner(Vehicle *this,unique_ptr<Person,_std::default_delete<Person>_> *o)

{
  bool bVar1;
  unique_ptr<Person,_std::default_delete<Person>_> *in_RSI;
  unique_ptr<Person,_std::default_delete<Person>_> *in_RDI;
  
  std::unique_ptr<Person,_std::default_delete<Person>_>::operator=(in_RSI,in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Person,_std::default_delete<Person>_> *)0x170b5d);
  return bVar1;
}

Assistant:

bool owner(std::unique_ptr<Person> o) { _owner = std::move(o); return !!_owner; }